

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureBarrierTests.cpp
# Opt level: O0

bool __thiscall gl4cts::TextureBarrierBaseTest::featureSupported(TextureBarrierBaseTest *this)

{
  bool bVar1;
  ContextInfo *this_00;
  TextureBarrierBaseTest *this_local;
  
  if (this->m_api == API_GL_ARB_texture_barrier) {
    this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
    bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_texture_barrier");
    if (bVar1) {
      return true;
    }
  }
  return this->m_api == API_GL_45core;
}

Assistant:

bool featureSupported()
	{
		return (m_api == TextureBarrierTests::API_GL_ARB_texture_barrier &&
				m_context.getContextInfo().isExtensionSupported("GL_ARB_texture_barrier")) ||
			   m_api == TextureBarrierTests::API_GL_45core;
	}